

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

void __thiscall
QTableViewPrivate::trimHiddenSelections(QTableViewPrivate *this,QItemSelectionRange *range)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  QModelIndex *this_00;
  int iVar8;
  quintptr *this_01;
  long in_FS_OFFSET;
  undefined4 uVar9;
  undefined4 uVar10;
  QPersistentModelIndexData *local_98;
  QPersistentModelIndexData *apQStack_90 [3];
  QModelIndex local_78;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = QPersistentModelIndex::row();
  iVar5 = QPersistentModelIndex::column();
  iVar6 = QPersistentModelIndex::row();
  iVar7 = QPersistentModelIndex::column();
  bVar3 = true;
  if (iVar4 <= iVar6) {
    do {
      bVar3 = QHeaderView::isSectionHidden(this->verticalHeader,iVar6);
      if (!bVar3) break;
      iVar8 = iVar6 + -1;
      bVar2 = iVar4 < iVar6;
      iVar6 = iVar8;
    } while (bVar2);
  }
  if (iVar5 <= iVar7) {
    do {
      bVar2 = QHeaderView::isSectionHidden(this->horizontalHeader,iVar7);
      if (!bVar2) {
        if (bVar3 == false) goto LAB_00583c5f;
        break;
      }
      bVar2 = iVar5 < iVar7;
      iVar7 = iVar7 + -1;
    } while (bVar2);
  }
  goto LAB_00583caf;
  while (iVar4 = iVar8 + 1, bVar3) {
LAB_00583c5f:
    iVar8 = iVar4;
    bVar3 = QHeaderView::isSectionHidden(this->verticalHeader,iVar8);
    if (iVar6 < iVar8) break;
  }
  do {
    iVar4 = iVar5;
    bVar3 = QHeaderView::isSectionHidden(this->horizontalHeader,iVar4);
    if (iVar7 < iVar4) break;
    iVar5 = iVar4 + 1;
  } while (bVar3);
  if (iVar8 <= iVar6 && iVar4 <= iVar7) {
    local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (this->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::parent();
    (**(code **)(*(long *)pQVar1 + 0x60))(&local_58,pQVar1,iVar6,iVar7,&local_78);
    local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (this->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::parent();
    (**(code **)(*(long *)pQVar1 + 0x60))(&local_78,pQVar1,iVar8,iVar4,(QModelIndex *)&local_98);
    this_00 = (QModelIndex *)&local_98;
    QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)this_00,&local_78);
    this_01 = (quintptr *)apQStack_90;
    QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)this_01,&local_58);
    iVar6 = *(int *)&(range->tl).d;
    iVar7 = *(int *)((long)&(range->tl).d + 4);
    uVar9 = *(undefined4 *)&(range->br).d;
    uVar10 = *(undefined4 *)((long)&(range->br).d + 4);
    (range->tl).d = local_98;
    (range->br).d = apQStack_90[0];
    goto LAB_00583cde;
  }
LAB_00583caf:
  this_00 = &local_58;
  local_58._0_8_ = (QPersistentModelIndexData *)0x0;
  local_58.i = 0;
  QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)this_00);
  this_01 = &local_58.i;
  QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)this_01);
  iVar6 = *(int *)&(range->tl).d;
  iVar7 = *(int *)((long)&(range->tl).d + 4);
  uVar9 = *(undefined4 *)&(range->br).d;
  uVar10 = *(undefined4 *)((long)&(range->br).d + 4);
  (range->tl).d = (QPersistentModelIndexData *)local_58._0_8_;
  (range->br).d = (QPersistentModelIndexData *)local_58.i;
LAB_00583cde:
  ((QModelIndex *)(this_01 + -1))->r = iVar6;
  ((QModelIndex *)(this_01 + -1))->c = iVar7;
  *(undefined4 *)this_01 = uVar9;
  *(undefined4 *)((long)this_01 + 4) = uVar10;
  QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)this_01);
  QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableViewPrivate::trimHiddenSelections(QItemSelectionRange *range) const
{
    Q_ASSERT(range && range->isValid());

    int top = range->top();
    int left = range->left();
    int bottom = range->bottom();
    int right = range->right();

    while (bottom >= top && verticalHeader->isSectionHidden(bottom))
        --bottom;
    while (right >= left && horizontalHeader->isSectionHidden(right))
        --right;

    if (top > bottom || left > right) { // everything is hidden
        *range = QItemSelectionRange();
        return;
    }

    while (verticalHeader->isSectionHidden(top) && top <= bottom)
        ++top;
    while (horizontalHeader->isSectionHidden(left) && left <= right)
        ++left;

    if (top > bottom || left > right) { // everything is hidden
        *range = QItemSelectionRange();
        return;
    }

    QModelIndex bottomRight = model->index(bottom, right, range->parent());
    QModelIndex topLeft = model->index(top, left, range->parent());
    *range = QItemSelectionRange(topLeft, bottomRight);
}